

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O3

string_view __thiscall wabt::GetExtension(wabt *this,string_view filename)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  wabt *pwVar4;
  size_type __size;
  long lVar5;
  string_view sVar6;
  
  pwVar4 = (wabt *)0x1ee0e1;
  if (this == (wabt *)0x0) {
    return (string_view)(ZEXT816(0x1ee0e1) << 0x40);
  }
  sVar3 = 0;
  lVar5 = 0;
  do {
    if ((wabt *)-lVar5 == this) goto LAB_00183c98;
    lVar1 = lVar5 + -1;
    lVar2 = lVar5 + (filename._M_len - 1);
    lVar5 = lVar1;
  } while (this[lVar2] != (wabt)0x2e);
  pwVar4 = this + lVar1 + filename._M_len;
  sVar3 = -lVar1;
LAB_00183c98:
  sVar6._M_str = (char *)pwVar4;
  sVar6._M_len = sVar3;
  return sVar6;
}

Assistant:

std::string_view GetExtension(std::string_view filename) {
  size_t pos = filename.find_last_of('.');
  if (pos == std::string_view::npos) {
    return "";
  }
  return filename.substr(pos);
}